

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze_live_input_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::AnalyzeLiveInputPass::Process(AnalyzeLiveInputPass *this)

{
  bool bVar1;
  IRContext *this_00;
  FeatureManager *this_01;
  Status status;
  AnalyzeLiveInputPass *this_local;
  
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_feature_mgr(this_00);
  bVar1 = FeatureManager::HasCapability(this_01,Shader);
  if (bVar1) {
    this_local._4_4_ = DoLiveInputAnalysis(this);
  }
  else {
    this_local._4_4_ = SuccessWithoutChange;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status AnalyzeLiveInputPass::Process() {
  // Current functionality assumes shader capability
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return Status::SuccessWithoutChange;
  Pass::Status status = DoLiveInputAnalysis();
  return status;
}